

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

void ecs_run_component_trigger
               (ecs_world_t *world,ecs_vector_t *trigger_vec,ecs_entity_t component,
               ecs_table_t *table,ecs_data_t *data,int32_t row,int32_t count)

{
  int32_t iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  int32_t columns [1];
  ecs_column_t *local_168;
  ecs_type_t types [1];
  ecs_entity_t components [1];
  ecs_iter_table_t table_data;
  ecs_world_t *local_110;
  undefined1 local_108 [8];
  undefined8 local_100;
  ecs_iter_table_t *local_f0;
  undefined8 local_e0;
  undefined4 local_d8;
  ecs_column_t *local_d0;
  long local_c8;
  undefined8 local_c0;
  int32_t local_a8;
  int32_t local_a4;
  
  _ecs_assert((_Bool)(world->in_progress ^ 1),0xc,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x111);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x111,
                  "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                 );
  }
  if ((table->flags & 2) == 0) {
    pvVar4 = _ecs_vector_first(data->entities,8,0x10);
    _ecs_assert(pvVar4 != (void *)0x0,0xc,(char *)0x0,"entities != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x118);
    if (pvVar4 == (void *)0x0) {
      __assert_fail("entities != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x118,
                    "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                   );
    }
    iVar1 = ecs_vector_count(data->entities);
    _ecs_assert(row < iVar1,0xc,(char *)0x0,"row < ecs_vector_count(data->entities)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x119);
    iVar1 = ecs_vector_count(data->entities);
    if (iVar1 <= row) {
      __assert_fail("row < ecs_vector_count(data->entities)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x119,
                    "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                   );
    }
    iVar1 = ecs_vector_count(data->entities);
    _ecs_assert(count + row <= iVar1,0xc,(char *)0x0,
                "(row + count) <= ecs_vector_count(data->entities)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x11a);
    iVar1 = ecs_vector_count(data->entities);
    if (iVar1 < count + row) {
      __assert_fail("(row + count) <= ecs_vector_count(data->entities)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x11a,
                    "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                   );
    }
    uVar2 = ecs_vector_count(trigger_vec);
    if (uVar2 != 0) {
      pvVar5 = _ecs_vector_first(trigger_vec,0x28,0x10);
      uVar3 = ecs_type_index_of(table->type,component);
      _ecs_assert(-1 < (int)uVar3,0xc,(char *)0x0,"index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0xdb);
      if ((int)uVar3 < 0) {
        __assert_fail("index >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0xdb,
                      "void run_component_trigger_for_entities(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entity_t *)"
                     );
      }
      components[0] = component;
      types[0] = ecs_type_from_entity(world,component);
      if ((int)uVar3 < table->column_count) {
        local_168 = data->columns;
        columns[0] = uVar3 + 1;
        if (local_168[uVar3].size == 0) {
          columns[0] = 0;
        }
      }
      else {
        columns[0] = 0;
        local_168 = data->columns;
      }
      table_data.columns = columns;
      table_data.data = (ecs_data_t *)0x0;
      table_data.components = components;
      table_data.types = types;
      table_data.references = (ecs_ref_t *)0x0;
      uVar7 = 0;
      table_data.table = table;
      memset(local_108,0,0xd8);
      local_e0 = 0x100000001;
      local_d8 = 1;
      local_d0 = local_168;
      local_a4 = count;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar7;
      }
      local_110 = world;
      local_f0 = &table_data;
      local_c8 = (long)pvVar4 + (long)(row * 8);
      local_a8 = row;
      for (; uVar6 * 0x28 - uVar7 != 0; uVar7 = uVar7 + 0x28) {
        local_100 = *(undefined8 *)((long)pvVar5 + uVar7 + 0x18);
        local_c0 = *(undefined8 *)((long)pvVar5 + uVar7 + 0x20);
        (**(code **)((long)pvVar5 + uVar7 + 8))(&local_110);
      }
    }
  }
  return;
}

Assistant:

static
void ecs_run_component_trigger(
    ecs_world_t * world,
    ecs_vector_t * trigger_vec,
    ecs_entity_t component,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count)
{
    ecs_assert(!world->in_progress, ECS_INTERNAL_ERROR, NULL);

    if (table->flags & EcsTableIsPrefab) {
        return;
    }

    ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);        
    ecs_assert(entities != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(row < ecs_vector_count(data->entities), ECS_INTERNAL_ERROR, NULL);
    ecs_assert((row + count) <= ecs_vector_count(data->entities), ECS_INTERNAL_ERROR, NULL);

    entities = ECS_OFFSET(entities, ECS_SIZEOF(ecs_entity_t) * row);

    run_component_trigger_for_entities(
        world, trigger_vec, component, table, data, row, count, entities);
}